

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::Export_MetadataDouble
          (X3DExporter *this,aiString *pKey,double pValue,size_t pTabLevel)

{
  undefined1 *puVar1;
  _Node *p_Var2;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator<char> local_89;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_48;
  double local_30;
  
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  puVar1 = local_88 + 0x10;
  local_88._0_8_ = puVar1;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  local_30 = pValue;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_88 + 0x20),pKey->data,&local_89);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48,(SAttribute *)local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
  if (local_68._M_dataplus._M_p != local_88 + 0x30) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_88._0_8_ != puVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  local_88._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"value","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x20),
             vsnprintf,0x148,"%f",local_30);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48,(SAttribute *)local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
  if (local_68._M_dataplus._M_p != local_88 + 0x30) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_88._0_8_ != puVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  local_88._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"MetadataDouble","");
  NodeHelper_OpenNode(this,(string *)local_88,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48);
  if ((undefined1 *)local_88._0_8_ != puVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_48);
  return;
}

Assistant:

void X3DExporter::Export_MetadataDouble(const aiString& pKey, const double pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", to_string(pValue)});
	NodeHelper_OpenNode("MetadataDouble", pTabLevel, true, attr_list);
}